

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

string * ot::commissioner::Console::Read_abi_cxx11_(void)

{
  string *in_RDI;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __s = anon_var_dwarf_66ec33 + 9;
  while ((__s == (char *)0x0 || (*__s == '\0'))) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,mPrompt_abi_cxx11_,DAT_002b7a58 + mPrompt_abi_cxx11_);
    std::__cxx11::string::append((char *)local_48);
    __s = (char *)readline(local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  add_history(__s);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string Console::Read()
{
    const char *line = "";

    while (line == nullptr || strlen(line) == 0)
    {
        line = readline((mPrompt + "> ").c_str());
    }

    add_history(line);

    return line;
}